

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallAndroidMKGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallAndroidMKGenerator::GenerateImportHeaderCode
          (cmExportInstallAndroidMKGenerator *this,ostream *os,string *param_2)

{
  cmTargetExport *pcVar1;
  cmInstallTargetGenerator *pcVar2;
  cmTarget *this_00;
  TargetType TVar3;
  size_t sVar4;
  ostream *poVar5;
  cmExportSet *pcVar6;
  pointer ppcVar7;
  long lVar8;
  bool bVar9;
  allocator local_d1;
  string dest;
  string path;
  string installDir;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string
            ((string *)&installDir,
             (string *)
             &(((this->super_cmExportInstallFileGenerator).IEGen)->super_cmInstallGenerator).
              Destination);
  std::operator<<(os,"LOCAL_PATH := $(call my-dir)\n");
  sVar4 = cmsys::SystemTools::CountChar(installDir._M_dataplus._M_p,'/');
  lVar8 = (sVar4 + 1) - (ulong)(installDir._M_string_length == 0);
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
    std::__cxx11::string::append((char *)&path);
  }
  poVar5 = std::operator<<(os,"_IMPORT_PREFIX := ");
  poVar5 = std::operator<<(poVar5,"$(LOCAL_PATH)");
  poVar5 = std::operator<<(poVar5,(string *)&path);
  std::operator<<(poVar5,"\n\n");
  pcVar6 = ((this->super_cmExportInstallFileGenerator).IEGen)->ExportSet;
  for (ppcVar7 = (pcVar6->TargetExports).
                 super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar7 !=
      (pcVar6->TargetExports).
      super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar7 = ppcVar7 + 1) {
    pcVar1 = *ppcVar7;
    TVar3 = cmGeneratorTarget::GetType(pcVar1->Target);
    if (TVar3 != INTERFACE_LIBRARY) {
      dest._M_dataplus._M_p = (pointer)&dest.field_2;
      dest._M_string_length = 0;
      dest.field_2._M_local_buf[0] = '\0';
      pcVar2 = pcVar1->LibraryGenerator;
      if (pcVar2 != (cmInstallTargetGenerator *)0x0) {
        std::__cxx11::string::string((string *)&local_70,"",&local_d1);
        cmInstallTargetGenerator::GetDestination(&local_50,pcVar2,&local_70);
        std::__cxx11::string::operator=((string *)&dest,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
      pcVar2 = pcVar1->ArchiveGenerator;
      if (pcVar2 != (cmInstallTargetGenerator *)0x0) {
        std::__cxx11::string::string((string *)&local_70,"",&local_d1);
        cmInstallTargetGenerator::GetDestination(&local_50,pcVar2,&local_70);
        std::__cxx11::string::operator=((string *)&dest,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
      this_00 = pcVar1->Target->Target;
      std::__cxx11::string::string((string *)&local_50,"__dest",(allocator *)&local_70);
      cmTarget::SetProperty(this_00,&local_50,dest._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&dest);
    }
    pcVar6 = ((this->super_cmExportInstallFileGenerator).IEGen)->ExportSet;
  }
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::~string((string *)&installDir);
  return;
}

Assistant:

void cmExportInstallAndroidMKGenerator::GenerateImportHeaderCode(
  std::ostream& os, const std::string&)
{
  std::string installDir = this->IEGen->GetDestination();
  os << "LOCAL_PATH := $(call my-dir)\n";
  size_t numDotDot = cmSystemTools::CountChar(installDir.c_str(), '/');
  numDotDot += installDir.empty() ? 0 : 1;
  std::string path;
  for (size_t n = 0; n < numDotDot; n++) {
    path += "/..";
  }
  os << "_IMPORT_PREFIX := "
     << "$(LOCAL_PATH)" << path << "\n\n";
  for (std::vector<cmTargetExport*>::const_iterator tei =
         this->IEGen->GetExportSet()->GetTargetExports()->begin();
       tei != this->IEGen->GetExportSet()->GetTargetExports()->end(); ++tei) {
    // Collect import properties for this target.
    cmTargetExport const* te = *tei;
    if (te->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    std::string dest;
    if (te->LibraryGenerator) {
      dest = te->LibraryGenerator->GetDestination("");
    }
    if (te->ArchiveGenerator) {
      dest = te->ArchiveGenerator->GetDestination("");
    }
    te->Target->Target->SetProperty("__dest", dest.c_str());
  }
}